

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O2

String<char> __thiscall Qentem::StringStream<char>::GetString(StringStream<char> *this)

{
  uint len_00;
  char *pcVar1;
  SizeT len;
  ulong uVar2;
  ulong extraout_RDX;
  StringStream<char> *in_RSI;
  String<char> SVar3;
  
  len_00 = in_RSI->length_;
  uVar2 = (ulong)len_00;
  if (len_00 < in_RSI->capacity_) {
    in_RSI->storage_[uVar2] = '\0';
    pcVar1 = in_RSI->storage_;
    in_RSI->storage_ = (char *)0x0;
    in_RSI->length_ = 0;
    in_RSI->capacity_ = 0;
    this->length_ = len_00;
    this->storage_ = pcVar1;
  }
  else {
    String<char>::String((String<char> *)this,in_RSI->storage_,len_00);
    Reset(in_RSI);
    uVar2 = extraout_RDX;
  }
  SVar3._8_8_ = uVar2;
  SVar3.storage_ = (char *)this;
  return SVar3;
}

Assistant:

String<Char_T> GetString() {
        if (Capacity() > Length()) {
            const SizeT len     = Length();
            Storage()[Length()] = Char_T{0};
            return String<Char_T>(Detach(), len);
        }

        String<Char_T> str{First(), Length()};

        Reset();

        return str;
    }